

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::setTransform(QGraphicsView *this,QTransform *matrix,bool combine)

{
  QTransform *this_00;
  QGraphicsViewPrivate *this_01;
  char cVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  undefined7 in_register_00000011;
  QTransform *pQVar5;
  qreal *pqVar6;
  long in_FS_OFFSET;
  byte bVar7;
  QTransform local_c0;
  QTransform local_70;
  long local_20;
  
  bVar7 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QGraphicsViewPrivate **)(this + 8);
  this_00 = &this_01->matrix;
  pQVar5 = this_00;
  pqVar6 = (qreal *)&local_70;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pqVar6 = pQVar5->m_matrix[0][0];
    pQVar5 = (QTransform *)(pQVar5->m_matrix[0] + 1);
    pqVar6 = pqVar6 + 1;
  }
  pQVar5 = this_00;
  if ((int)CONCAT71(in_register_00000011,combine) == 0) {
    lVar4 = 0x4a;
  }
  else {
    QTransform::operator*(&local_c0,matrix);
    lVar4 = 0x4a;
    matrix = &local_c0;
  }
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined1 *)pQVar5->m_matrix[0] = *(undefined1 *)matrix->m_matrix[0];
    matrix = (QTransform *)((long)matrix + (ulong)bVar7 * -2 + 1);
    pQVar5 = (QTransform *)((long)pQVar5 + (ulong)bVar7 * -2 + 1);
  }
  cVar1 = QTransform::operator==(&local_70,this_00);
  if (cVar1 == '\0') {
    bVar2 = QTransform::isIdentity(this_00);
    *(uint *)&this_01->field_0x300 =
         (uint)bVar2 * 0x10 + (*(uint *)&this_01->field_0x300 & 0xfffffeef) + 0x100;
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_01->scene);
    if (bVar2) {
      QGraphicsViewPrivate::recalculateContentSize(this_01);
      QGraphicsViewPrivate::centerView(this_01,this_01->transformationAnchor);
    }
    else {
      QGraphicsViewPrivate::updateLastCenterPoint(this_01);
    }
    uVar3 = *(uint *)&this_01->field_0x300;
    if ((uVar3 & 1) != 0) {
      QGraphicsViewPrivate::replayLastMouseEvent(this_01);
      uVar3 = *(uint *)&this_01->field_0x300;
    }
    *(uint *)&this_01->field_0x300 = uVar3 & 0xfffffeff;
    QGraphicsViewPrivate::updateAll(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::setTransform(const QTransform &matrix, bool combine )
{
    Q_D(QGraphicsView);
    QTransform oldMatrix = d->matrix;
    if (!combine)
        d->matrix = matrix;
    else
        d->matrix = matrix * d->matrix;
    if (oldMatrix == d->matrix)
        return;

    d->identityMatrix = d->matrix.isIdentity();
    d->transforming = true;
    if (d->scene) {
        d->recalculateContentSize();
        d->centerView(d->transformationAnchor);
    } else {
        d->updateLastCenterPoint();
    }

    if (d->sceneInteractionAllowed)
        d->replayLastMouseEvent();
    d->transforming = false;

    // Any matrix operation requires a full update.
    d->updateAll();
}